

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socketio_berkeley.c
# Opt level: O0

int socketio_setoption(CONCRETE_IO_HANDLE socket_io,char *optionName,void *value)

{
  undefined1 auVar1 [16];
  int iVar2;
  int *piVar3;
  size_t sVar4;
  LOGGER_LOG p_Var5;
  void *pvVar6;
  size_t local_78;
  size_t local_70;
  ulong local_68;
  size_t local_60;
  long local_58;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  size_t malloc_size;
  SOCKET_IO_INSTANCE *socket_io_instance;
  int result;
  void *value_local;
  char *optionName_local;
  CONCRETE_IO_HANDLE socket_io_local;
  
  if (((socket_io == (CONCRETE_IO_HANDLE)0x0) || (optionName == (char *)0x0)) ||
     (value == (void *)0x0)) {
    socket_io_instance._4_4_ = 0x4ba;
  }
  else {
    iVar2 = strcmp(optionName,"tcp_keepalive");
    if (iVar2 == 0) {
      socket_io_instance._4_4_ = setsockopt(*socket_io,1,9,value,4);
      if (socket_io_instance._4_4_ == -1) {
        piVar3 = __errno_location();
        socket_io_instance._4_4_ = *piVar3;
      }
    }
    else {
      iVar2 = strcmp(optionName,"tcp_keepalive_time");
      if (iVar2 == 0) {
        socket_io_instance._4_4_ = setsockopt(*socket_io,6,4,value,4);
        if (socket_io_instance._4_4_ == -1) {
          piVar3 = __errno_location();
          socket_io_instance._4_4_ = *piVar3;
        }
      }
      else {
        iVar2 = strcmp(optionName,"tcp_keepalive_interval");
        if (iVar2 == 0) {
          socket_io_instance._4_4_ = setsockopt(*socket_io,6,5,value,4);
          if (socket_io_instance._4_4_ == -1) {
            piVar3 = __errno_location();
            socket_io_instance._4_4_ = *piVar3;
          }
        }
        else {
          iVar2 = strcmp(optionName,"net_interface_mac_address");
          if (iVar2 == 0) {
            sVar4 = strlen((char *)value);
            if (sVar4 == 0) {
              p_Var5 = xlogging_get_log_function();
              if (p_Var5 != (LOGGER_LOG)0x0) {
                (*p_Var5)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/socketio_berkeley.c"
                          ,"socketio_setoption",0x4dc,1,"option value must be a valid mac address");
              }
              socket_io_instance._4_4_ = 0x4dd;
            }
            else {
              sVar4 = strlen((char *)value);
              if (sVar4 < 0xfffffffffffffffe) {
                sVar4 = strlen((char *)value);
                local_58 = sVar4 + 1;
              }
              else {
                local_58 = -1;
              }
              if (local_58 == 0) {
                local_60 = 0;
              }
              else {
                sVar4 = strlen((char *)value);
                if (sVar4 < 0xfffffffffffffffe) {
                  sVar4 = strlen((char *)value);
                  local_68 = sVar4 + 1;
                }
                else {
                  local_68 = 0xffffffffffffffff;
                }
                auVar1._8_8_ = 0;
                auVar1._0_8_ = local_68;
                if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar1,0) == 0) {
                  local_78 = 0xffffffffffffffff;
                }
                else {
                  sVar4 = strlen((char *)value);
                  if (sVar4 < 0xfffffffffffffffe) {
                    local_70 = strlen((char *)value);
                    local_70 = local_70 + 1;
                  }
                  else {
                    local_70 = 0xffffffffffffffff;
                  }
                  local_78 = local_70;
                }
                local_60 = local_78;
              }
              if (local_60 == 0xffffffffffffffff) {
                p_Var5 = xlogging_get_log_function();
                if (p_Var5 != (LOGGER_LOG)0x0) {
                  (*p_Var5)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/socketio_berkeley.c"
                            ,"socketio_setoption",0x4e1,1,"invalid malloc size");
                }
                socket_io_instance._4_4_ = 0x4e2;
                *(undefined8 *)((long)socket_io + 0x48) = 0;
              }
              else {
                pvVar6 = malloc(local_60);
                *(void **)((long)socket_io + 0x48) = pvVar6;
                if (pvVar6 == (void *)0x0) {
                  p_Var5 = xlogging_get_log_function();
                  if (p_Var5 != (LOGGER_LOG)0x0) {
                    (*p_Var5)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/socketio_berkeley.c"
                              ,"socketio_setoption",0x4e7,1,
                              "failed setting net_interface_mac_address option (malloc failed)");
                  }
                  socket_io_instance._4_4_ = 0x4e8;
                }
                else {
                  strcpy(*(char **)((long)socket_io + 0x48),(char *)value);
                  strtoup(*(char **)((long)socket_io + 0x48));
                  socket_io_instance._4_4_ = 0;
                }
              }
            }
          }
          else {
            iVar2 = strcmp(optionName,"ADDRESS_TYPE");
            if (iVar2 == 0) {
              socket_io_instance._4_4_ =
                   socketio_setaddresstype_option((SOCKET_IO_INSTANCE *)socket_io,(char *)value);
            }
            else {
              socket_io_instance._4_4_ = 0x4f8;
            }
          }
        }
      }
    }
  }
  return socket_io_instance._4_4_;
}

Assistant:

int socketio_setoption(CONCRETE_IO_HANDLE socket_io, const char* optionName, const void* value)
{
    int result;

    if (socket_io == NULL ||
        optionName == NULL ||
        value == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        SOCKET_IO_INSTANCE* socket_io_instance = (SOCKET_IO_INSTANCE*)socket_io;

        if (strcmp(optionName, "tcp_keepalive") == 0)
        {
            result = setsockopt(socket_io_instance->socket, SOL_SOCKET, SO_KEEPALIVE, value, sizeof(int));
            if (result == -1) result = errno;
        }
        else if (strcmp(optionName, "tcp_keepalive_time") == 0)
        {
#ifdef __APPLE__
            result = setsockopt(socket_io_instance->socket, IPPROTO_TCP, TCP_KEEPALIVE, value, sizeof(int));
#else
            result = setsockopt(socket_io_instance->socket, SOL_TCP, TCP_KEEPIDLE, value, sizeof(int));
#endif
            if (result == -1) result = errno;
        }
        else if (strcmp(optionName, "tcp_keepalive_interval") == 0)
        {
            result = setsockopt(socket_io_instance->socket, SOL_TCP, TCP_KEEPINTVL, value, sizeof(int));
            if (result == -1) result = errno;
        }
        else if (strcmp(optionName, OPTION_NET_INT_MAC_ADDRESS) == 0)
        {
#ifdef __APPLE__
            LogError("option not supported.");
            result = MU_FAILURE;
#else
            size_t malloc_size;
            if (strlen(value) == 0)
            {
                LogError("option value must be a valid mac address");
                result = MU_FAILURE;
            }
            else if ((malloc_size = safe_multiply_size_t(safe_add_size_t(strlen(value), 1), sizeof(char))) == SIZE_MAX)
            {
                LogError("invalid malloc size");
                result = MU_FAILURE;
                socket_io_instance->target_mac_address = NULL;
            }
            else if ((socket_io_instance->target_mac_address = (char*)malloc(malloc_size)) == NULL)
            {
                LogError("failed setting net_interface_mac_address option (malloc failed)");
                result = MU_FAILURE;
            }
            else
            {
                strcpy(socket_io_instance->target_mac_address, value);
                strtoup(socket_io_instance->target_mac_address);
                result = 0;
            }
#endif
        }
        else if (strcmp(optionName, OPTION_ADDRESS_TYPE) == 0)
        {
            result = socketio_setaddresstype_option(socket_io_instance, (const char*)value);
        }
        else
        {
            result = MU_FAILURE;
        }
    }

    return result;
}